

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLs_AccessARKODEMassMem
              (void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKLsMassMem *arkls_mem)

{
  ARKLsMassMem pAVar1;
  int line;
  int iVar2;
  int error_code;
  ARKodeMem ark_mem_00;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar2 = -1;
    ark_mem_00 = (ARKodeMem)0x0;
    error_code = -1;
    line = 0x1006;
  }
  else {
    *ark_mem = (ARKodeMem)arkode_mem;
    pAVar1 = (ARKLsMassMem)(**(code **)((long)arkode_mem + 0x218))();
    if (pAVar1 != (ARKLsMassMem)0x0) {
      *arkls_mem = pAVar1;
      return 0;
    }
    ark_mem_00 = *ark_mem;
    msgfmt = "Mass matrix solver memory is NULL.";
    iVar2 = -6;
    error_code = -6;
    line = 0x100e;
  }
  arkProcessError(ark_mem_00,error_code,line,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int arkLs_AccessARKODEMassMem(void* arkode_mem, const char* fname,
                              ARKodeMem* ark_mem, ARKLsMassMem* arkls_mem)
{
  void* ark_step_massmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARKLS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_ARKMEM_NULL);
    return (ARKLS_MEM_NULL);
  }
  *ark_mem         = (ARKodeMem)arkode_mem;
  ark_step_massmem = (*ark_mem)->step_getmassmem(*ark_mem);
  if (ark_step_massmem == NULL)
  {
    arkProcessError(*ark_mem, ARKLS_MASSMEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_MASSMEM_NULL);
    return (ARKLS_MASSMEM_NULL);
  }
  *arkls_mem = (ARKLsMassMem)ark_step_massmem;
  return (ARKLS_SUCCESS);
}